

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::ExprTree::ExprTree(ExprTree *this,ExprTree *param_1)

{
  ExprTree *param_1_local;
  ExprTree *this_local;
  
  this->expr = param_1->expr;
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::vector(&this->children,&param_1->children);
  this->result_count = param_1->result_count;
  return;
}

Assistant:

explicit ExprTree(const Expr* expr, Index result_count)
      : expr(expr), result_count(result_count) {}